

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_expectOneCallHoweverMultipleHappened_TestShell::
~TEST_MockCallTest_expectOneCallHoweverMultipleHappened_TestShell
          (TEST_MockCallTest_expectOneCallHoweverMultipleHappened_TestShell *this)

{
  TEST_MockCallTest_expectOneCallHoweverMultipleHappened_TestShell *this_local;
  
  ~TEST_MockCallTest_expectOneCallHoweverMultipleHappened_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockCallTest, expectOneCallHoweverMultipleHappened)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo")->callWasMade(1);
    expectations.addFunction("foo")->callWasMade(2);
    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "foo", expectations);

    mock().expectOneCall("foo");
    mock().expectOneCall("foo");
    mock().actualCall("foo");
    mock().actualCall("foo");
    mock().actualCall("foo");

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}